

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O2

bool __thiscall
leveldb::InternalFilterPolicy::KeyMayMatch(InternalFilterPolicy *this,Slice *key,Slice *f)

{
  FilterPolicy *pFVar1;
  int iVar2;
  Slice local_20;
  
  pFVar1 = this->user_policy_;
  local_20 = ExtractUserKey(key);
  iVar2 = (*pFVar1->_vptr_FilterPolicy[4])(pFVar1,&local_20,f);
  return SUB41(iVar2,0);
}

Assistant:

bool InternalFilterPolicy::KeyMayMatch(const Slice& key, const Slice& f) const {
  return user_policy_->KeyMayMatch(ExtractUserKey(key), f);
}